

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O2

string * tinyusdz::io::GetBaseDir(string *__return_storage_ptr__,string *filepath)

{
  long lVar1;
  allocator local_11;
  
  lVar1 = ::std::__cxx11::string::find_last_of((char *)filepath,0x340525);
  if (lVar1 == -1) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_11);
  }
  else {
    ::std::__cxx11::string::find_last_of((char *)filepath,0x340525);
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filepath);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetBaseDir(const std::string &filepath) {
  if (filepath.find_last_of("/\\") != std::string::npos)
    return filepath.substr(0, filepath.find_last_of("/\\"));
  return "";
}